

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

void set_iterate(set s,set_cb_iterate iterate_cb,set_cb_iterate_args args)

{
  int iVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  pair p;
  size_t pair_iterator;
  bucket b;
  size_t bucket_iterator;
  ulong local_30;
  ulong local_20;
  
  if (((in_RDI != 0) && (*(long *)(in_RDI + 0x18) != 0)) && (in_RSI != (code *)0x0)) {
    for (local_20 = 0; local_20 < *(ulong *)(in_RDI + 8); local_20 = local_20 + 1) {
      puVar2 = (ulong *)(*(long *)(in_RDI + 0x18) + local_20 * 0x18);
      if ((puVar2[2] != 0) && (*puVar2 != 0)) {
        for (local_30 = 0; local_30 < *puVar2; local_30 = local_30 + 1) {
          puVar3 = (undefined8 *)(puVar2[2] + local_30 * 0x10);
          iVar1 = (*in_RSI)(in_RDI,*puVar3,puVar3[1],in_RDX);
          if (iVar1 != 0) {
            return;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void set_iterate(set s, set_cb_iterate iterate_cb, set_cb_iterate_args args)
{
	if (s != NULL && s->buckets != NULL && iterate_cb != NULL)
	{
		size_t bucket_iterator;

		for (bucket_iterator = 0; bucket_iterator < s->capacity; ++bucket_iterator)
		{
			bucket b = &s->buckets[bucket_iterator];

			if (b->pairs != NULL && b->count > 0)
			{
				size_t pair_iterator;

				for (pair_iterator = 0; pair_iterator < b->count; ++pair_iterator)
				{
					pair p = &b->pairs[pair_iterator];

					if (iterate_cb(s, p->key, p->value, args) != 0)
					{
						return;
					}
				}
			}
		}
	}
}